

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::EndToEndSSIMTest_EndtoEndSSIMTest_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::EndToEndSSIMTest_EndtoEndSSIMTest_Test>
           *this)

{
  EndToEndSSIMTest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (EndToEndSSIMTest *)operator_new(0x420);
  anon_unknown.dwarf_1918b1f::EndToEndSSIMTest::EndToEndSSIMTest(this_00);
  (this_00->
  super_CodecTestWith3Params<libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__EndToEndSSIMTest_00f4d4e8;
  (this_00->
  super_CodecTestWith3Params<libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__EndToEndSSIMTest_EndtoEndSSIMTest_Test_00f4d540;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__EndToEndSSIMTest_EndtoEndSSIMTest_Test_00f4d560;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }